

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucs.c
# Opt level: O2

void unicode_emit(void *ctx,long output)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  int iVar4;
  wchar_t outval;
  
  if (output == 0xffff) {
    pwVar3 = *(wchar_t **)((long)ctx + 0x10);
    if (pwVar3 != (wchar_t *)0x0) {
      iVar4 = *(int *)((long)ctx + 0x18);
      goto LAB_00113e1e;
    }
    outval = L'�';
  }
  else {
    outval = (wchar_t)output;
  }
  pwVar3 = &outval;
  iVar4 = 1;
LAB_00113e1e:
  if (*(int *)((long)ctx + 8) < iVar4) {
    *(undefined4 *)((long)ctx + 0x1c) = 1;
  }
  else {
    for (; 0 < iVar4; iVar4 = iVar4 + -1) {
      wVar1 = *pwVar3;
      pwVar3 = pwVar3 + 1;
      pwVar2 = *ctx;
      *(wchar_t **)ctx = pwVar2 + 1;
      *pwVar2 = wVar1;
      *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
    }
  }
  return;
}

Assistant:

static void unicode_emit(void *ctx, long int output)
{
    struct unicode_emit_param *param = (struct unicode_emit_param *)ctx;
    wchar_t outval;
    wchar_t const *p;
    int outlen;

    if (output == ERROR) {
        if (param->errstr) {
            p = param->errstr;
            outlen = param->errlen;
        } else {
            outval = 0xFFFD;           /* U+FFFD REPLACEMENT CHARACTER */
            p = &outval;
            outlen = 1;
        }
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}